

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O2

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>::TPZCompElHDivCollapsed
          (TPZCompElHDivCollapsed<pzshape::TPZShapeQuad> *this,TPZCompMesh *mesh,
          TPZCompElHDivCollapsed<pzshape::TPZShapeQuad> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  iterator iVar1;
  mapped_type_conflict *pmVar2;
  mapped_type_conflict mVar3;
  ostream *poVar4;
  long lVar5;
  int64_t glIdx;
  pointer_____offset_0x60___ *local_1e0;
  char *local_1d8 [4];
  stringstream sout;
  ostream local_1a8 [376];
  
  *(undefined ***)
   &(this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZSavable_0174bda0;
  local_1e0 = &PTR_PTR_017483b0;
  TPZCompElHDiv<pzshape::TPZShapeQuad>::TPZCompElHDiv
            (&this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>,&PTR_PTR_017483b0,mesh,
             &copy->super_TPZCompElHDiv<pzshape::TPZShapeQuad>,gl2lcConMap,gl2lcElMap);
  *(undefined ***)
   &(this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElHDivCollapsed_01747fd8;
  *(undefined4 *)&this->fbottom_c_index = 0xffffffff;
  *(undefined4 *)((long)&this->fbottom_c_index + 4) = 0xffffffff;
  *(undefined4 *)&this->ftop_c_index = 0xffffffff;
  *(undefined4 *)((long)&this->ftop_c_index + 4) = 0xffffffff;
  this->fbottom_side_orient = -1;
  this->ftop_side_orient = 1;
  (this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
  super_TPZInterpolatedElement.super_TPZInterpolationSpace.fPreferredOrder =
       (copy->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).super_TPZIntelGen<pzshape::TPZShapeQuad>.
       super_TPZInterpolatedElement.super_TPZInterpolationSpace.fPreferredOrder;
  lVar5 = 0;
  do {
    if (lVar5 == 5) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHDivCollapsed.cpp"
                 ,0x60);
    }
    glIdx = (copy->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).fConnectIndexes.super_TPZVec<long>.
            fStore[lVar5];
    mVar3 = -1;
    if (glIdx != -1) {
      iVar1 = std::
              _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
              ::find(&gl2lcConMap->_M_t,&glIdx);
      if ((_Rb_tree_header *)iVar1._M_node == &(gl2lcConMap->_M_t)._M_impl.super__Rb_tree_header) {
        std::__cxx11::stringstream::stringstream((stringstream *)&sout);
        poVar4 = std::operator<<(local_1a8,"ERROR in : ");
        poVar4 = std::operator<<(poVar4,
                                 "TPZCompElHDivCollapsed<pzshape::TPZShapeQuad>::TPZCompElHDivCollapsed(TPZCompMesh &, const TPZCompElHDivCollapsed<TSHAPE> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TSHAPE = pzshape::TPZShapeQuad]"
                                );
        poVar4 = std::operator<<(poVar4," trying to clone the connect index: ");
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::operator<<(poVar4," wich is not in mapped connect indexes!");
        std::__cxx11::stringbuf::str();
        poVar4 = std::operator<<((ostream *)&std::cout,local_1d8[0]);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)local_1d8);
        (this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).fConnectIndexes.super_TPZVec<long>.fStore
        [lVar5] = -1;
        std::__cxx11::stringstream::~stringstream((stringstream *)&sout);
        return;
      }
      pmVar2 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](gl2lcConMap,&glIdx);
      mVar3 = *pmVar2;
    }
    (this->super_TPZCompElHDiv<pzshape::TPZShapeQuad>).fConnectIndexes.super_TPZVec<long>.fStore
    [lVar5] = mVar3;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

TPZCompElHDivCollapsed<TSHAPE>::TPZCompElHDivCollapsed(TPZCompMesh &mesh,
												 const TPZCompElHDivCollapsed<TSHAPE> &copy,
												 std::map<int64_t,int64_t> & gl2lcConMap,
												 std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElHDivCollapsed::ClassId),
TPZCompElHDiv<TSHAPE>(mesh,copy,gl2lcConMap,gl2lcElMap)
{
	
	this-> fPreferredOrder = copy.fPreferredOrder;
	int i;
	for(i=0;i<=TSHAPE::NFacets;i++)
	{
		int64_t lcIdx = -1;
		int64_t glIdx = copy.fConnectIndexes[i];
		if(glIdx == -1)
		{
			// nothing to clone
			this->fConnectIndexes[i] = -1;
			continue;
		}
		if (gl2lcConMap.find(glIdx) != gl2lcConMap.end())
		{
			lcIdx = gl2lcConMap[glIdx];
		}
		else
		{
			std::stringstream sout;
			sout << "ERROR in : " << __PRETTY_FUNCTION__
			<< " trying to clone the connect index: " << glIdx
			<< " wich is not in mapped connect indexes!";
			LOGPZ_ERROR(logger, sout.str().c_str());
			this-> fConnectIndexes[i] = -1;
			return;
		}
		this-> fConnectIndexes[i] = lcIdx;
	}
    // write the code when this constructor is called
    // Initialize top and bottom connects properly if needed be!
    DebugStop();
}